

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::parse_function_record(ModuleParseContext *this,BlockOrRecord *entry)

{
  value_type vVar1;
  Function *this_00;
  undefined8 uVar2;
  void *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  PointerType *this_01;
  Type *type_00;
  reference __x;
  Function *local_1070;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
  local_1068;
  Function *local_1050;
  Function *func;
  size_type id;
  FunctionType *func_type;
  Type *pTStack_1030;
  bool is_proto;
  Type *type;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  BlockOrRecord *entry_local;
  ModuleParseContext *this_local;
  
  if ((this->use_strtab & 1U) == 0) {
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&entry->ops);
    if (sVar4 < 3) {
      this_local._7_1_ = false;
    }
    else {
      pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
               operator[](&entry->ops,0);
      pTStack_1030 = get_type(this,*pvVar5);
      if (pTStack_1030 == (Type *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                 operator[](&entry->ops,2);
        func_type._7_1_ = *pvVar5 != 0;
        id = (size_type)dyn_cast<LLVMBC::FunctionType>(pTStack_1030);
        if ((FunctionType *)id == (FunctionType *)0x0) {
          this_01 = cast<LLVMBC::PointerType>(pTStack_1030);
          type_00 = PointerType::getElementType(this_01);
          id = (size_type)cast<LLVMBC::FunctionType>(type_00);
        }
        if (id == 0) {
          this_local._7_1_ = false;
        }
        else {
          func = (Function *)
                 std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
                 size(&this->values);
          local_1050 = LLVMContext::
                       construct<LLVMBC::Function,LLVMBC::FunctionType*&,unsigned_long&,LLVMBC::Module&>
                                 (this->context,(FunctionType **)&id,(unsigned_long *)&func,
                                  this->module);
          sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                            (&entry->ops);
          if (4 < sVar4) {
            pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                     operator[](&entry->ops,4);
            if (*pvVar5 != 0) {
              pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                       operator[](&entry->ops,4);
              vVar1 = *pvVar5;
              sVar4 = std::
                      vector<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>
                      ::size(&this->attribute_lists);
              this_00 = local_1050;
              if (vVar1 - 1 < sVar4) {
                pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                         ::operator[](&entry->ops,4);
                __x = std::
                      vector<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>
                      ::operator[](&this->attribute_lists,*pvVar5 - 1);
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
                ::vector(&local_1068,__x);
                Function::set_attributes(this_00,&local_1068);
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
                ::~vector(&local_1068);
              }
            }
          }
          local_1070 = local_1050;
          std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::push_back
                    (&this->values,(value_type *)&local_1070);
          if ((func_type._7_1_ & 1) == 0) {
            std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::
            push_back(&this->functions_with_bodies,&local_1050);
          }
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Unknown module code 2 which uses strtab.\n");
      fflush(_stderr);
    }
    else {
      snprintf((char *)&type,0x1000,"Unknown module code 2 which uses strtab.\n");
      uVar2 = buffer._4088_8_;
      pvVar3 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar2)(pvVar3,2,&type);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ModuleParseContext::parse_function_record(const BlockOrRecord &entry)
{
	if (use_strtab)
	{
		LOGE("Unknown module code 2 which uses strtab.\n");
		return false;
	}

	if (entry.ops.size() < 3)
		return false;

	auto *type = get_type(entry.ops[0]);
	if (!type)
		return false;

	// Calling convention is [1], not relevant.
	bool is_proto = entry.ops[2];
	// Lots of other irrelevant arguments ...

	auto *func_type = dyn_cast<FunctionType>(type);
	if (!func_type)
		func_type = cast<FunctionType>(cast<PointerType>(type)->getElementType());

	if (!func_type)
		return false;

	auto id = values.size();
	auto *func = context->construct<Function>(func_type, id, *module);

	if (entry.ops.size() >= 5 && entry.ops[4] != 0 && (entry.ops[4] - 1) < attribute_lists.size())
		func->set_attributes(attribute_lists[entry.ops[4] - 1]);

	values.push_back(func);

	if (!is_proto)
		functions_with_bodies.push_back(func);

	return true;
}